

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderRenderCase::setupDefaultInputs(ShaderRenderCase *this,int programID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  long lVar7;
  NotSupportedError *pNVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  pointer pTVar12;
  undefined4 uVar13;
  string local_58;
  ShaderRenderCase *local_38;
  long lVar6;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  setupDefaultUniforms(this->m_renderCtx,programID);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"post uniform setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x1e3);
  pTVar12 = (this->m_textures).
            super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (0 < (int)((ulong)((long)(this->m_textures).
                              super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12) >> 3) *
          0x38e38e39) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      if (*(int *)((long)&pTVar12->m_type + lVar11) == 0) goto LAB_0049369e;
      uVar5 = (*local_38->m_renderCtx->_vptr_RenderContext[2])();
      iVar3 = *(int *)((long)&pTVar12->m_type + lVar11);
      if ((uVar5 & 0x3ff) == 2) {
        if (iVar3 == 4) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"3D texture binding is not supported","");
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_58);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        if (iVar3 == 3) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"2D array texture binding is not supported","");
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_58);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        if (*(int *)((long)&(pTVar12->m_sampler).compare + lVar11) != 0) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Shadow lookups are not supported","");
          tcu::NotSupportedError::NotSupportedError(pNVar8,&local_58);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
      }
      lVar7 = 0x68;
      switch(iVar3) {
      case 1:
        bVar2 = false;
        uVar10 = 0xde1;
        break;
      case 2:
        uVar10 = 0x8513;
        lVar7 = 0x178;
        goto LAB_004935a4;
      case 3:
        uVar10 = 0x8c1a;
LAB_004935a4:
        bVar2 = false;
        break;
      case 4:
        uVar10 = 0x806f;
        bVar2 = true;
        break;
      default:
        bVar2 = false;
        uVar10 = 0;
        uVar13 = 0;
        goto LAB_004935b5;
      }
      uVar13 = *(undefined4 *)(*(long *)((long)&pTVar12->m_binding + lVar11) + lVar7);
LAB_004935b5:
      (**(code **)(lVar6 + 8))((int)lVar9 + 0x84c0);
      (**(code **)(lVar6 + 0xb8))(uVar10,uVar13);
      pcVar1 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar12->m_sampler).wrapS + lVar11));
      (*pcVar1)(uVar10,0x2802,dVar4);
      pcVar1 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar12->m_sampler).wrapT + lVar11));
      (*pcVar1)(uVar10,0x2803,dVar4);
      pcVar1 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLFilterMode(*(FilterMode *)((long)&(pTVar12->m_sampler).minFilter + lVar11));
      (*pcVar1)(uVar10,0x2801,dVar4);
      pcVar1 = *(code **)(lVar6 + 0x1360);
      dVar4 = glu::getGLFilterMode(*(FilterMode *)((long)&(pTVar12->m_sampler).magFilter + lVar11));
      (*pcVar1)(uVar10,0x2800,dVar4);
      if (bVar2) {
        pcVar1 = *(code **)(lVar6 + 0x1360);
        dVar4 = glu::getGLWrapMode(*(WrapMode *)((long)&(pTVar12->m_sampler).wrapR + lVar11));
        (*pcVar1)(0x806f,0x8072,dVar4);
      }
      if (*(int *)((long)&(pTVar12->m_sampler).compare + lVar11) != 0) {
        (**(code **)(lVar6 + 0x1360))(uVar10,0x884c,0x884e);
        pcVar1 = *(code **)(lVar6 + 0x1360);
        dVar4 = glu::getGLCompareFunc
                          (*(CompareMode *)((long)&(pTVar12->m_sampler).compare + lVar11));
        (*pcVar1)(uVar10,0x884d,dVar4);
      }
LAB_0049369e:
      lVar9 = lVar9 + 1;
      pTVar12 = (local_38->m_textures).
                super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x48;
    } while (lVar9 < (int)((ulong)((long)(local_38->m_textures).
                                         super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12)
                          >> 3) * 0x38e38e39);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"texture sampler setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x219);
  return;
}

Assistant:

void ShaderRenderCase::setupDefaultInputs (int programID)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	// SETUP UNIFORMS.

	setupDefaultUniforms(m_renderCtx, programID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "post uniform setup");

	// SETUP TEXTURES.

	for (int ndx = 0; ndx < (int)m_textures.size(); ndx++)
	{
		const TextureBinding&	tex			= m_textures[ndx];
		const tcu::Sampler&		sampler		= tex.getSampler();
		deUint32				texTarget	= GL_NONE;
		deUint32				texObj		= 0;

		if (tex.getType() == TextureBinding::TYPE_NONE)
			continue;

		// Feature check.
		if (m_renderCtx.getType().getAPI() == glu::ApiType::es(2,0))
		{
			if (tex.getType() == TextureBinding::TYPE_2D_ARRAY)
				throw tcu::NotSupportedError("2D array texture binding is not supported");

			if (tex.getType() == TextureBinding::TYPE_3D)
				throw tcu::NotSupportedError("3D texture binding is not supported");

			if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
				throw tcu::NotSupportedError("Shadow lookups are not supported");
		}

		switch (tex.getType())
		{
			case TextureBinding::TYPE_2D:		texTarget = GL_TEXTURE_2D;			texObj = tex.get2D()->getGLTexture();		break;
			case TextureBinding::TYPE_CUBE_MAP:	texTarget = GL_TEXTURE_CUBE_MAP;	texObj = tex.getCube()->getGLTexture();		break;
			case TextureBinding::TYPE_2D_ARRAY:	texTarget = GL_TEXTURE_2D_ARRAY;	texObj = tex.get2DArray()->getGLTexture();	break;
			case TextureBinding::TYPE_3D:		texTarget = GL_TEXTURE_3D;			texObj = tex.get3D()->getGLTexture();		break;
			default:
				DE_ASSERT(DE_FALSE);
		}

		gl.activeTexture(GL_TEXTURE0+ndx);
		gl.bindTexture(texTarget, texObj);
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(sampler.wrapS));
		gl.texParameteri(texTarget, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(sampler.wrapT));
		gl.texParameteri(texTarget, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(sampler.minFilter));
		gl.texParameteri(texTarget, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(sampler.magFilter));

		if (texTarget == GL_TEXTURE_3D)
			gl.texParameteri(texTarget, GL_TEXTURE_WRAP_R, glu::getGLWrapMode(sampler.wrapR));

		if (sampler.compare != tcu::Sampler::COMPAREMODE_NONE)
		{
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(texTarget, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(sampler.compare));
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "texture sampler setup");
}